

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tanh_sinh_detail.hpp
# Opt level: O3

void __thiscall
boost::math::quadrature::detail::
tanh_sinh_detail<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
::extend_refinements
          (tanh_sinh_detail<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
           *this)

{
  pointer pvVar1;
  int32_t iVar2;
  int iVar3;
  uint uVar4;
  fpclass_type fVar5;
  undefined8 uVar6;
  unsigned_long uVar7;
  ulong uVar8;
  vector<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>,std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>>
  *this_00;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  pos;
  multiply_immediates local_269;
  cpp_dec_float<100U,_int,_void> local_268;
  pthread_mutex_t *local_218;
  unsigned_long local_210;
  cpp_dec_float<100U,_int,_void> *local_208;
  cpp_dec_float<100U,_int,_void> *local_200;
  cpp_dec_float<100U,_int,_void> local_1f8;
  cpp_dec_float<100U,_int,_void> local_1a8;
  ulong local_150;
  long local_148;
  long local_140;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  local_138;
  expression<boost::multiprecision::detail::multiply_immediates,_int,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
  local_e8;
  undefined1 local_d8 [16];
  uint local_c8 [2];
  uint auStack_c0 [2];
  uint local_b8 [2];
  uint auStack_b0 [2];
  uint local_a8 [2];
  uint auStack_a0 [2];
  int local_98;
  bool local_94;
  fpclass_type local_90;
  int32_t iStack_8c;
  undefined1 local_88 [16];
  uint local_78 [2];
  uint auStack_70 [2];
  uint local_68 [2];
  uint auStack_60 [2];
  uint local_58 [2];
  uint auStack_50 [2];
  int local_48;
  bool local_44;
  fpclass_type local_40;
  int32_t iStack_3c;
  
  local_218 = (pthread_mutex_t *)&this->m_mutex;
  iVar3 = pthread_mutex_lock(local_218);
  if (iVar3 != 0) {
    uVar6 = std::__throw_system_error(iVar3);
    pthread_mutex_unlock(local_218);
    _Unwind_Resume(uVar6);
  }
  if ((ulong)(this->m_committed_refinements).super___atomic_base<unsigned_int>._M_i <
      this->m_max_refinements) {
    LOCK();
    (this->m_committed_refinements).super___atomic_base<unsigned_int>._M_i =
         (this->m_committed_refinements).super___atomic_base<unsigned_int>._M_i + 1;
    UNLOCK();
    uVar4 = (this->m_committed_refinements).super___atomic_base<unsigned_int>._M_i;
    uVar8 = (ulong)uVar4;
    multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
              (&local_1f8,1,(type *)0x0);
    local_268.fpclass = cpp_dec_float_finite;
    local_268.prec_elem = 0x10;
    local_268.data._M_elems[0] = 0;
    local_268.data._M_elems[1] = 0;
    local_268.data._M_elems[2] = 0;
    local_268.data._M_elems[3] = 0;
    local_268.data._M_elems[4] = 0;
    local_268.data._M_elems[5] = 0;
    local_268.data._M_elems[6] = 0;
    local_268.data._M_elems[7] = 0;
    local_268.data._M_elems[8] = 0;
    local_268.data._M_elems[9] = 0;
    local_268.data._M_elems[10] = 0;
    local_268.data._M_elems[0xb] = 0;
    local_268.data._M_elems[0xc] = 0;
    local_268.data._M_elems[0xd] = 0;
    local_268.data._M_elems._56_5_ = 0;
    local_268.data._M_elems[0xf]._1_3_ = 0;
    local_268.exp = 0;
    local_268.neg = false;
    multiprecision::detail::
    number_kind_floating_pointldexp_funct<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
    ::operator()((number_kind_floating_pointldexp_funct<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  *)&local_1a8,&local_268,&local_1f8,-uVar4);
    local_138.m_backend.data._M_elems[1] = local_268.data._M_elems[1];
    local_138.m_backend.data._M_elems[0] = local_268.data._M_elems[0];
    local_138.m_backend.data._M_elems[3] = local_268.data._M_elems[3];
    local_138.m_backend.data._M_elems[2] = local_268.data._M_elems[2];
    local_138.m_backend.data._M_elems[5] = local_268.data._M_elems[5];
    local_138.m_backend.data._M_elems[4] = local_268.data._M_elems[4];
    local_138.m_backend.data._M_elems[7] = local_268.data._M_elems[7];
    local_138.m_backend.data._M_elems[6] = local_268.data._M_elems[6];
    local_138.m_backend.data._M_elems[9] = local_268.data._M_elems[9];
    local_138.m_backend.data._M_elems[8] = local_268.data._M_elems[8];
    local_138.m_backend.data._M_elems[0xb] = local_268.data._M_elems[0xb];
    local_138.m_backend.data._M_elems[10] = local_268.data._M_elems[10];
    local_138.m_backend.data._M_elems[0xd] = local_268.data._M_elems[0xd];
    local_138.m_backend.data._M_elems[0xc] = local_268.data._M_elems[0xc];
    local_138.m_backend.data._M_elems[0xf]._1_3_ = local_268.data._M_elems[0xf]._1_3_;
    local_138.m_backend.data._M_elems._56_5_ = local_268.data._M_elems._56_5_;
    local_138.m_backend.exp = local_268.exp;
    local_138.m_backend.neg = local_268.neg;
    local_138.m_backend.fpclass = local_268.fpclass;
    local_138.m_backend.prec_elem = local_268.prec_elem;
    local_200 = (cpp_dec_float<100U,_int,_void> *)&this->m_t_max;
    local_268.fpclass = cpp_dec_float_finite;
    local_268.prec_elem = 0x10;
    local_268.data._M_elems[0] = 0;
    local_268.data._M_elems[1] = 0;
    local_268.data._M_elems[2] = 0;
    local_268.data._M_elems[3] = 0;
    local_268.data._M_elems[4] = 0;
    local_268.data._M_elems[5] = 0;
    local_268.data._M_elems[6] = 0;
    local_268.data._M_elems[7] = 0;
    local_268.data._M_elems[8] = 0;
    local_268.data._M_elems[9] = 0;
    local_268.data._M_elems[10] = 0;
    local_268.data._M_elems[0xb] = 0;
    local_268.data._M_elems[0xc] = 0;
    local_268.data._M_elems[0xd] = 0;
    local_268.data._M_elems._56_5_ = 0;
    local_268.data._M_elems[0xf]._1_3_ = 0;
    local_268.exp = 0;
    local_268.neg = false;
    local_88._0_8_ = local_200;
    local_88._8_8_ = &local_138;
    multiprecision::
    number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
    ::
    do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::subtract_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>>
              ((number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
                *)&local_268,
               (expression<boost::multiprecision::detail::subtract_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                *)local_88,(subtract_immediates *)&local_e8);
    local_d8._4_4_ = local_268.data._M_elems[1];
    local_d8._0_4_ = local_268.data._M_elems[0];
    local_d8._8_8_ = CONCAT44(local_268.data._M_elems[3],local_268.data._M_elems[2]);
    local_c8[1] = local_268.data._M_elems[5];
    local_c8[0] = local_268.data._M_elems[4];
    auStack_c0[1] = local_268.data._M_elems[7];
    auStack_c0[0] = local_268.data._M_elems[6];
    local_b8[1] = local_268.data._M_elems[9];
    local_b8[0] = local_268.data._M_elems[8];
    auStack_b0[1] = local_268.data._M_elems[0xb];
    auStack_b0[0] = local_268.data._M_elems[10];
    local_a8[1] = local_268.data._M_elems[0xd];
    local_a8[0] = local_268.data._M_elems[0xc];
    auStack_a0[1]._1_3_ = local_268.data._M_elems[0xf]._1_3_;
    auStack_a0._0_5_ = local_268.data._M_elems._56_5_;
    local_98 = local_268.exp;
    local_94 = local_268.neg;
    local_90 = local_268.fpclass;
    iStack_8c = local_268.prec_elem;
    local_e8.arg1 = 2;
    local_268.fpclass = cpp_dec_float_finite;
    local_268.prec_elem = 0x10;
    local_268.data._M_elems[0] = 0;
    local_268.data._M_elems[1] = 0;
    local_268.data._M_elems[2] = 0;
    local_268.data._M_elems[3] = 0;
    local_268.data._M_elems[4] = 0;
    local_268.data._M_elems[5] = 0;
    local_268.data._M_elems[6] = 0;
    local_268.data._M_elems[7] = 0;
    local_268.data._M_elems[8] = 0;
    local_268.data._M_elems[9] = 0;
    local_268.data._M_elems[10] = 0;
    local_268.data._M_elems[0xb] = 0;
    local_268.data._M_elems[0xc] = 0;
    local_268.data._M_elems[0xd] = 0;
    local_268.data._M_elems._56_5_ = 0;
    local_268.data._M_elems[0xf]._1_3_ = 0;
    local_268.exp = 0;
    local_268.neg = false;
    local_e8.arg2 = &local_138;
    multiprecision::
    number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
    ::
    do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,int,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>>
              ((number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
                *)&local_268,&local_e8,&local_269);
    local_88._0_8_ = CONCAT44(local_268.data._M_elems[1],local_268.data._M_elems[0]);
    local_88._8_8_ = CONCAT44(local_268.data._M_elems[3],local_268.data._M_elems[2]);
    local_78[1] = local_268.data._M_elems[5];
    local_78[0] = local_268.data._M_elems[4];
    auStack_70[1] = local_268.data._M_elems[7];
    auStack_70[0] = local_268.data._M_elems[6];
    local_68[1] = local_268.data._M_elems[9];
    local_68[0] = local_268.data._M_elems[8];
    auStack_60[1] = local_268.data._M_elems[0xb];
    auStack_60[0] = local_268.data._M_elems[10];
    local_58[1] = local_268.data._M_elems[0xd];
    local_58[0] = local_268.data._M_elems[0xc];
    auStack_50[1]._1_3_ = local_268.data._M_elems[0xf]._1_3_;
    auStack_50._0_5_ = local_268.data._M_elems._56_5_;
    local_48 = local_268.exp;
    local_44 = local_268.neg;
    local_40 = local_268.fpclass;
    iStack_3c = local_268.prec_elem;
    local_268.fpclass = cpp_dec_float_finite;
    local_268.prec_elem = 0x10;
    local_268.data._M_elems[0] = 0;
    local_268.data._M_elems[1] = 0;
    local_268.data._M_elems[2] = 0;
    local_268.data._M_elems[3] = 0;
    local_268.data._M_elems[4] = 0;
    local_268.data._M_elems[5] = 0;
    local_268.data._M_elems[6] = 0;
    local_268.data._M_elems[7] = 0;
    local_268.data._M_elems[8] = 0;
    local_268.data._M_elems[9] = 0;
    local_268.data._M_elems[10] = 0;
    local_268.data._M_elems[0xb] = 0;
    local_268.data._M_elems[0xc] = 0;
    local_268.data._M_elems[0xd] = 0;
    local_268.data._M_elems._56_5_ = 0;
    local_268.data._M_elems[0xf]._1_3_ = 0;
    local_268.exp = 0;
    local_268.neg = false;
    multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              (&local_268,(cpp_dec_float<100U,_int,_void> *)local_d8,
               (cpp_dec_float<100U,_int,_void> *)local_88);
    local_1a8.data._M_elems[0xf]._1_3_ = local_268.data._M_elems[0xf]._1_3_;
    local_1a8.data._M_elems._56_5_ = local_268.data._M_elems._56_5_;
    local_1a8.data._M_elems[0xc] = local_268.data._M_elems[0xc];
    local_1a8.data._M_elems[0xd] = local_268.data._M_elems[0xd];
    local_1a8.data._M_elems[8] = local_268.data._M_elems[8];
    local_1a8.data._M_elems[9] = local_268.data._M_elems[9];
    local_1a8.data._M_elems[10] = local_268.data._M_elems[10];
    local_1a8.data._M_elems[0xb] = local_268.data._M_elems[0xb];
    local_1a8.data._M_elems[4] = local_268.data._M_elems[4];
    local_1a8.data._M_elems[5] = local_268.data._M_elems[5];
    local_1a8.data._M_elems[6] = local_268.data._M_elems[6];
    local_1a8.data._M_elems[7] = local_268.data._M_elems[7];
    local_1a8.data._M_elems[0] = local_268.data._M_elems[0];
    local_1a8.data._M_elems[1] = local_268.data._M_elems[1];
    local_1a8.data._M_elems[2] = local_268.data._M_elems[2];
    local_1a8.data._M_elems[3] = local_268.data._M_elems[3];
    local_1a8.exp = local_268.exp;
    local_1a8.neg = local_268.neg;
    local_1a8.fpclass = local_268.fpclass;
    local_1a8.prec_elem = local_268.prec_elem;
    local_268.fpclass = cpp_dec_float_finite;
    local_268.prec_elem = 0x10;
    local_268.data._M_elems[0] = 0;
    local_268.data._M_elems[1] = 0;
    local_268.data._M_elems[2] = 0;
    local_268.data._M_elems[3] = 0;
    local_268.data._M_elems[4] = 0;
    local_268.data._M_elems[5] = 0;
    local_268.data._M_elems[6] = 0;
    local_268.data._M_elems[7] = 0;
    local_268.data._M_elems[8] = 0;
    local_268.data._M_elems[9] = 0;
    local_268.data._M_elems[10] = 0;
    local_268.data._M_elems[0xb] = 0;
    local_268.data._M_elems[0xc] = 0;
    local_268.data._M_elems[0xd] = 0;
    local_268.data._M_elems._56_5_ = 0;
    local_268.data._M_elems[0xf]._1_3_ = 0;
    local_268.exp = 0;
    local_268.neg = false;
    multiprecision::detail::
    number_kind_floating_pointceil_funct<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>_>
    ::operator()((number_kind_floating_pointceil_funct<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>_>
                  *)&local_e8,&local_268,&local_1a8);
    local_1f8.data._M_elems[1] = local_268.data._M_elems[1];
    local_1f8.data._M_elems[0] = local_268.data._M_elems[0];
    local_1f8.data._M_elems[3] = local_268.data._M_elems[3];
    local_1f8.data._M_elems[2] = local_268.data._M_elems[2];
    local_1f8.data._M_elems[5] = local_268.data._M_elems[5];
    local_1f8.data._M_elems[4] = local_268.data._M_elems[4];
    local_1f8.data._M_elems[7] = local_268.data._M_elems[7];
    local_1f8.data._M_elems[6] = local_268.data._M_elems[6];
    local_1f8.data._M_elems[9] = local_268.data._M_elems[9];
    local_1f8.data._M_elems[8] = local_268.data._M_elems[8];
    local_1f8.data._M_elems[0xb] = local_268.data._M_elems[0xb];
    local_1f8.data._M_elems[10] = local_268.data._M_elems[10];
    local_1f8.data._M_elems[0xd] = local_268.data._M_elems[0xd];
    local_1f8.data._M_elems[0xc] = local_268.data._M_elems[0xc];
    local_1f8.data._M_elems[0xf]._1_3_ = local_268.data._M_elems[0xf]._1_3_;
    local_1f8.data._M_elems._56_5_ = local_268.data._M_elems._56_5_;
    local_1f8.exp = local_268.exp;
    local_1f8.neg = local_268.neg;
    local_1f8.fpclass = local_268.fpclass;
    local_1f8.prec_elem = local_268.prec_elem;
    iVar3 = itrunc<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                      ((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                        *)&local_1f8,
                       (policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
                        *)&local_268);
    local_140 = uVar8 * 3;
    std::
    vector<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
    ::reserve((this->m_abscissas).
              super__Vector_base<std::vector<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>,_std::allocator<std::vector<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + uVar8,(long)iVar3);
    std::
    vector<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
    ::reserve((this->m_weights).
              super__Vector_base<std::vector<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>,_std::allocator<std::vector<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + uVar8,(long)iVar3);
    local_1f8.data._M_elems[0xc] = local_138.m_backend.data._M_elems[0xc];
    local_1f8.data._M_elems[0xd] = local_138.m_backend.data._M_elems[0xd];
    local_1f8.data._M_elems[0xe] = local_138.m_backend.data._M_elems[0xe];
    local_1f8.data._M_elems[0xf] = local_138.m_backend.data._M_elems[0xf];
    local_1f8.data._M_elems[8] = local_138.m_backend.data._M_elems[8];
    local_1f8.data._M_elems[9] = local_138.m_backend.data._M_elems[9];
    local_1f8.data._M_elems[10] = local_138.m_backend.data._M_elems[10];
    local_1f8.data._M_elems[0xb] = local_138.m_backend.data._M_elems[0xb];
    local_1f8.data._M_elems[4] = local_138.m_backend.data._M_elems[4];
    local_1f8.data._M_elems[5] = local_138.m_backend.data._M_elems[5];
    local_1f8.data._M_elems[6] = local_138.m_backend.data._M_elems[6];
    local_1f8.data._M_elems[7] = local_138.m_backend.data._M_elems[7];
    local_1f8.data._M_elems[0] = local_138.m_backend.data._M_elems[0];
    local_1f8.data._M_elems[1] = local_138.m_backend.data._M_elems[1];
    local_1f8.data._M_elems[2] = local_138.m_backend.data._M_elems[2];
    local_1f8.data._M_elems[3] = local_138.m_backend.data._M_elems[3];
    local_1f8.exp = local_138.m_backend.exp;
    local_1f8.neg = local_138.m_backend.neg;
    fVar5 = local_138.m_backend.fpclass;
    iVar2 = local_138.m_backend.prec_elem;
    local_1f8.fpclass = local_138.m_backend.fpclass;
    local_1f8.prec_elem = local_138.m_backend.prec_elem;
    uVar7 = 0;
    local_138.m_backend.fpclass = fVar5;
    local_138.m_backend.prec_elem = iVar2;
    if ((fVar5 != cpp_dec_float_NaN) &&
       ((this->m_t_max).base.m_backend.fpclass != cpp_dec_float_NaN)) {
      local_208 = (cpp_dec_float<100U,_int,_void> *)&this->m_t_crossover;
      local_210 = 0;
      local_150 = uVar8;
      local_148 = uVar8 * 0x18;
      while (iVar3 = multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               (&local_1f8,local_200), iVar3 < 0) {
        fVar5 = (this->m_t_crossover).base.m_backend.fpclass;
        if (fVar5 != cpp_dec_float_NaN && local_1f8.fpclass != cpp_dec_float_NaN) {
          uVar4 = multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                            (&local_1f8,local_208);
          local_210 = local_210 + (uVar4 >> 0x1f);
          fVar5 = (this->m_t_crossover).base.m_backend.fpclass;
        }
        this_00 = (vector<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>,std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>>
                   *)((long)&(((this->m_abscissas).
                               super__Vector_base<std::vector<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>,_std::allocator<std::vector<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
                             )._M_impl + local_148);
        if (((local_1f8.fpclass == cpp_dec_float_NaN) || (fVar5 == cpp_dec_float_NaN)) ||
           (iVar3 = multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                              (&local_1f8,local_208), -1 < iVar3)) {
          abscissa_complement_at_t
                    ((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                      *)&local_1a8,
                     (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                      *)&local_1f8);
          local_268.data._M_elems[0] = local_1a8.data._M_elems[0];
          local_268.data._M_elems[0xd] = local_1a8.data._M_elems[0xd];
          local_268.data._M_elems._56_5_ = local_1a8.data._M_elems._56_5_;
          local_268.data._M_elems[0xf]._1_3_ = local_1a8.data._M_elems[0xf]._1_3_;
          local_268.data._M_elems[9] = local_1a8.data._M_elems[9];
          local_268.data._M_elems[10] = local_1a8.data._M_elems[10];
          local_268.data._M_elems[0xb] = local_1a8.data._M_elems[0xb];
          local_268.data._M_elems[0xc] = local_1a8.data._M_elems[0xc];
          local_268.data._M_elems[5] = local_1a8.data._M_elems[5];
          local_268.data._M_elems[6] = local_1a8.data._M_elems[6];
          local_268.data._M_elems[7] = local_1a8.data._M_elems[7];
          local_268.data._M_elems[8] = local_1a8.data._M_elems[8];
          local_268.data._M_elems[1] = local_1a8.data._M_elems[1];
          local_268.data._M_elems[2] = local_1a8.data._M_elems[2];
          local_268.data._M_elems[3] = local_1a8.data._M_elems[3];
          local_268.data._M_elems[4] = local_1a8.data._M_elems[4];
          local_268.exp = local_1a8.exp;
          local_268.neg =
               (bool)((local_1a8.data._M_elems[0] != 0 || local_1a8.fpclass != cpp_dec_float_finite)
                     ^ local_1a8.neg);
          local_268.fpclass = local_1a8.fpclass;
          local_268.prec_elem = local_1a8.prec_elem;
        }
        else {
          abscissa_at_t((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                         *)&local_268,
                        (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                         *)&local_1f8);
        }
        std::
        vector<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>,std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>>
        ::
        emplace_back<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>
                  (this_00,(mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                            *)&local_268);
        local_d8._0_4_ = 2;
        local_d8._8_8_ = &local_138;
        local_268.fpclass = cpp_dec_float_finite;
        local_268.prec_elem = 0x10;
        local_268.data._M_elems[0] = 0;
        local_268.data._M_elems[1] = 0;
        local_268.data._M_elems[2] = 0;
        local_268.data._M_elems[3] = 0;
        local_268.data._M_elems[4] = 0;
        local_268.data._M_elems[5] = 0;
        local_268.data._M_elems[6] = 0;
        local_268.data._M_elems[7] = 0;
        local_268.data._M_elems[8] = 0;
        local_268.data._M_elems[9] = 0;
        local_268.data._M_elems[10] = 0;
        local_268.data._M_elems[0xb] = 0;
        local_268.data._M_elems[0xc] = 0;
        local_268.data._M_elems[0xd] = 0;
        local_268.data._M_elems._56_5_ = 0;
        local_268.data._M_elems[0xf]._1_3_ = 0;
        local_268.exp = 0;
        local_268.neg = false;
        multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
        ::
        do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,int,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
                    *)&local_268,
                   (expression<boost::multiprecision::detail::multiply_immediates,_int,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                    *)local_d8,(multiply_immediates *)local_88);
        local_1a8.data._M_elems[0xf]._1_3_ = local_268.data._M_elems[0xf]._1_3_;
        local_1a8.data._M_elems._56_5_ = local_268.data._M_elems._56_5_;
        local_1a8.data._M_elems[0] = local_268.data._M_elems[0];
        local_1a8.data._M_elems[1] = local_268.data._M_elems[1];
        local_1a8.data._M_elems[2] = local_268.data._M_elems[2];
        local_1a8.data._M_elems[3] = local_268.data._M_elems[3];
        local_1a8.data._M_elems[4] = local_268.data._M_elems[4];
        local_1a8.data._M_elems[5] = local_268.data._M_elems[5];
        local_1a8.data._M_elems[6] = local_268.data._M_elems[6];
        local_1a8.data._M_elems[7] = local_268.data._M_elems[7];
        local_1a8.data._M_elems[8] = local_268.data._M_elems[8];
        local_1a8.data._M_elems[9] = local_268.data._M_elems[9];
        local_1a8.data._M_elems[10] = local_268.data._M_elems[10];
        local_1a8.data._M_elems[0xb] = local_268.data._M_elems[0xb];
        local_1a8.data._M_elems[0xc] = local_268.data._M_elems[0xc];
        local_1a8.data._M_elems[0xd] = local_268.data._M_elems[0xd];
        local_1a8.exp = local_268.exp;
        local_1a8.neg = local_268.neg;
        local_1a8.fpclass = local_268.fpclass;
        local_1a8.prec_elem = local_268.prec_elem;
        multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=(&local_1f8,&local_1a8);
        if ((local_1f8.fpclass == cpp_dec_float_NaN) ||
           ((this->m_t_max).base.m_backend.fpclass == cpp_dec_float_NaN)) break;
      }
      uVar7 = local_210;
      uVar8 = local_150;
    }
    (this->m_first_complements).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_start[uVar8] = uVar7;
    local_1f8.data._M_elems[0xc] = local_138.m_backend.data._M_elems[0xc];
    local_1f8.data._M_elems[0xd] = local_138.m_backend.data._M_elems[0xd];
    local_1f8.data._M_elems[0xe] = local_138.m_backend.data._M_elems[0xe];
    local_1f8.data._M_elems[0xf] = local_138.m_backend.data._M_elems[0xf];
    local_1f8.data._M_elems[8] = local_138.m_backend.data._M_elems[8];
    local_1f8.data._M_elems[9] = local_138.m_backend.data._M_elems[9];
    local_1f8.data._M_elems[10] = local_138.m_backend.data._M_elems[10];
    local_1f8.data._M_elems[0xb] = local_138.m_backend.data._M_elems[0xb];
    local_1f8.data._M_elems[4] = local_138.m_backend.data._M_elems[4];
    local_1f8.data._M_elems[5] = local_138.m_backend.data._M_elems[5];
    local_1f8.data._M_elems[6] = local_138.m_backend.data._M_elems[6];
    local_1f8.data._M_elems[7] = local_138.m_backend.data._M_elems[7];
    local_1f8.data._M_elems[0] = local_138.m_backend.data._M_elems[0];
    local_1f8.data._M_elems[1] = local_138.m_backend.data._M_elems[1];
    local_1f8.data._M_elems[2] = local_138.m_backend.data._M_elems[2];
    local_1f8.data._M_elems[3] = local_138.m_backend.data._M_elems[3];
    local_1f8.prec_elem = local_138.m_backend.prec_elem;
    local_1f8.fpclass = local_138.m_backend.fpclass;
    local_1f8.exp = local_138.m_backend.exp;
    local_1f8.neg = local_138.m_backend.neg;
    if ((local_138.m_backend.fpclass != cpp_dec_float_NaN) &&
       ((this->m_t_max).base.m_backend.fpclass != cpp_dec_float_NaN)) {
      while (iVar3 = multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               (&local_1f8,local_200), iVar3 < 0) {
        pvVar1 = (this->m_weights).
                 super__Vector_base<std::vector<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>,_std::allocator<std::vector<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        weight_at_t((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                     *)&local_268,
                    (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                     *)&local_1f8);
        std::
        vector<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>,std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>>
        ::
        emplace_back<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>
                  ((vector<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>,std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>>
                    *)((long)&(pvVar1->
                              super__Vector_base<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
                              )._M_impl.super__Vector_impl_data + local_140 * 8),
                   (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                    *)&local_268);
        local_d8._0_4_ = 2;
        local_d8._8_8_ = &local_138;
        local_268.fpclass = cpp_dec_float_finite;
        local_268.prec_elem = 0x10;
        local_268.data._M_elems[0] = 0;
        local_268.data._M_elems[1] = 0;
        local_268.data._M_elems[2] = 0;
        local_268.data._M_elems[3] = 0;
        local_268.data._M_elems[4] = 0;
        local_268.data._M_elems[5] = 0;
        local_268.data._M_elems[6] = 0;
        local_268.data._M_elems[7] = 0;
        local_268.data._M_elems[8] = 0;
        local_268.data._M_elems[9] = 0;
        local_268.data._M_elems[10] = 0;
        local_268.data._M_elems[0xb] = 0;
        local_268.data._M_elems[0xc] = 0;
        local_268.data._M_elems[0xd] = 0;
        local_268.data._M_elems._56_5_ = 0;
        local_268.data._M_elems[0xf]._1_3_ = 0;
        local_268.exp = 0;
        local_268.neg = false;
        multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
        ::
        do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,int,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
                    *)&local_268,
                   (expression<boost::multiprecision::detail::multiply_immediates,_int,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                    *)local_d8,(multiply_immediates *)local_88);
        local_1a8.data._M_elems[0xf]._1_3_ = local_268.data._M_elems[0xf]._1_3_;
        local_1a8.data._M_elems._56_5_ = local_268.data._M_elems._56_5_;
        local_1a8.data._M_elems[0] = local_268.data._M_elems[0];
        local_1a8.data._M_elems[1] = local_268.data._M_elems[1];
        local_1a8.data._M_elems[2] = local_268.data._M_elems[2];
        local_1a8.data._M_elems[3] = local_268.data._M_elems[3];
        local_1a8.data._M_elems[4] = local_268.data._M_elems[4];
        local_1a8.data._M_elems[5] = local_268.data._M_elems[5];
        local_1a8.data._M_elems[6] = local_268.data._M_elems[6];
        local_1a8.data._M_elems[7] = local_268.data._M_elems[7];
        local_1a8.data._M_elems[8] = local_268.data._M_elems[8];
        local_1a8.data._M_elems[9] = local_268.data._M_elems[9];
        local_1a8.data._M_elems[10] = local_268.data._M_elems[10];
        local_1a8.data._M_elems[0xb] = local_268.data._M_elems[0xb];
        local_1a8.data._M_elems[0xc] = local_268.data._M_elems[0xc];
        local_1a8.data._M_elems[0xd] = local_268.data._M_elems[0xd];
        local_1a8.exp = local_268.exp;
        local_1a8.neg = local_268.neg;
        local_1a8.fpclass = local_268.fpclass;
        local_1a8.prec_elem = local_268.prec_elem;
        multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=(&local_1f8,&local_1a8);
        if ((local_1f8.fpclass == cpp_dec_float_NaN) ||
           ((this->m_t_max).base.m_backend.fpclass == cpp_dec_float_NaN)) break;
      }
    }
  }
  pthread_mutex_unlock(local_218);
  return;
}

Assistant:

void extend_refinements()const
   {
#ifndef BOOST_MATH_NO_ATOMIC_INT
      boost::detail::lightweight_mutex::scoped_lock guard(m_mutex);
#endif
      //
      // Check some other thread hasn't got here after we read the atomic variable, but before we got here:
      //
#ifndef BOOST_MATH_NO_ATOMIC_INT
      if (m_committed_refinements.load() >= m_max_refinements)
         return;
#else
      if (m_committed_refinements >= m_max_refinements)
         return;
#endif

      using std::ldexp;
      using std::ceil;
      ++m_committed_refinements;
#ifndef BOOST_MATH_NO_ATOMIC_INT
      std::size_t row = m_committed_refinements.load();
#else
      std::size_t row = m_committed_refinements;
#endif
      Real h = ldexp(Real(1), -static_cast<int>(row));
      std::size_t first_complement = 0;
      std::size_t n = boost::math::itrunc(ceil((m_t_max - h) / (2 * h)));
      m_abscissas[row].reserve(n);
      m_weights[row].reserve(n);
      for (Real pos = h; pos < m_t_max; pos += 2 * h)
      {
         if (pos < m_t_crossover)
            ++first_complement;
         m_abscissas[row].push_back(pos < m_t_crossover ? abscissa_at_t(pos) : -abscissa_complement_at_t(pos));
      }
      m_first_complements[row] = first_complement;
      for (Real pos = h; pos < m_t_max; pos += 2 * h)
         m_weights[row].push_back(weight_at_t(pos));
   }